

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall
Search::predictor::make_new_pointer<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,size_t new_size)

{
  uint *__src;
  size_t sVar1;
  uint **ppuVar2;
  uint *puVar3;
  long in_RDX;
  v_array<unsigned_int> *in_RSI;
  uint *old_pointer;
  size_t old_size;
  size_t in_stack_00000198;
  
  sVar1 = v_array<unsigned_int>::size(in_RSI);
  ppuVar2 = v_array<unsigned_int>::begin(in_RSI);
  __src = *ppuVar2;
  puVar3 = calloc_or_throw<unsigned_int>(in_stack_00000198);
  ppuVar2 = v_array<unsigned_int>::begin(in_RSI);
  *ppuVar2 = puVar3;
  ppuVar2 = v_array<unsigned_int>::begin(in_RSI);
  puVar3 = *ppuVar2;
  ppuVar2 = v_array<unsigned_int>::end(in_RSI);
  *ppuVar2 = puVar3 + in_RDX;
  ppuVar2 = v_array<unsigned_int>::end(in_RSI);
  in_RSI->end_array = *ppuVar2;
  ppuVar2 = v_array<unsigned_int>::begin(in_RSI);
  memcpy(*ppuVar2,__src,sVar1 << 2);
  return;
}

Assistant:

void predictor::make_new_pointer(v_array<T>& A, size_t new_size)
{
  size_t old_size = A.size();
  T* old_pointer = A.begin();
  A.begin() = calloc_or_throw<T>(new_size);
  A.end() = A.begin() + new_size;
  A.end_array = A.end();
  memcpy(A.begin(), old_pointer, old_size * sizeof(T));
}